

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cpp
# Opt level: O2

void * __thiscall Cache::malloc(Cache *this,size_t __size)

{
  SpanList *this_00;
  Span *pSVar1;
  Span **ppSVar2;
  long lVar3;
  void *pvVar4;
  long lVar5;
  Span *p;
  Span *this_01;
  long lVar6;
  
  lVar6 = 1;
  lVar3 = 0x14;
  do {
    lVar5 = lVar3;
    if (lVar5 + 0x10 == 0x444) goto LAB_001043ae;
    lVar3 = lVar5 + 0x10;
  } while (*(int *)((long)spanInfo[0] + lVar5) < (int)__size);
  lVar6 = (long)*(int *)(&UNK_001059bc + lVar5);
LAB_001043ae:
  this_00 = this->alloc + lVar6;
  pSVar1 = this->alloc[lVar6].list;
  this_01 = pSVar1;
  if (pSVar1 == (Span *)0x0) {
    std::mutex::lock(&this->mtx);
    __size = (size_t)Central::malloc((Central *)(&this->field_0x430 + lVar6 * 0x28),
                                     (size_t)this->spanMap);
    SpanList::pushBack(this_00,(Span *)__size);
  }
  else {
    do {
      if (this_01->allocCount < this_01->nelems) goto LAB_00104455;
      ppSVar2 = &this_01->next;
      this_01 = *ppSVar2;
    } while (*ppSVar2 != pSVar1);
    std::mutex::lock(&this->mtx);
    __size = (size_t)Central::malloc((Central *)(&this->field_0x430 + lVar6 * 0x28),
                                     (size_t)this->spanMap);
    SpanList::pushFront(this_00,(Span *)__size);
  }
  this_01 = this_00->list;
  pthread_mutex_unlock((pthread_mutex_t *)&this->mtx);
LAB_00104455:
  pvVar4 = Span::malloc(this_01,__size);
  return pvVar4;
}

Assistant:

void *Cache::malloc(int size) {
    // 根据size, 选择一个合适的class
    int spanClass = 1;
    for (int i = 1; i < spanClasses; i++) {
        if (size <= spanInfo[i][1]) {
            spanClass = spanInfo[i][0];
            break;
        }
    }
    SpanList* spanList = &(this->alloc[spanClass]);  // 要用指针!
    /*
     * 三种情况
     * 1. 列表中没有一个span, 即 span == nullptr
     * 2. 列表中有span, 但是都没有了空间
     * 3. 列表中有span, 并且存在空间, 可以分配
     *
     * 情况 1, 2 都需要向central中请求空间
     */
    Span* span = nullptr;
    if (spanList->list == nullptr) {  // 情况 1
        // 锁
        mtx.lock();
        spanList->pushBack(ctl[spanClass].malloc(spanMap));  // central.malloc 会返回一个 span指针
        span = spanList->list;
        // 解锁
        mtx.unlock();
    } else {
        auto p = spanList->list;
        do {
            if (p->allocCount < p->nelems) {  // 有可分配的
                span = p;  // 第三种情况
                break;
            }
            p = p->next;
        } while (p != spanList->list);
        if (span == nullptr) {  // 第二种情况
            // 锁
            mtx.lock();
            spanList->pushFront(ctl[spanClass].malloc(spanMap));
            span = spanList->list;
            // 解锁
            mtx.unlock();
        }
    }
    return span->malloc();
}